

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O2

bool __thiscall
glcts::TessellationShaderVertexSpacing::isPointOnLine
          (TessellationShaderVertexSpacing *this,_tess_coordinate_cartesian *line_v1,
          _tess_coordinate_cartesian *line_v2,_tess_coordinate_cartesian *point)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = line_v1->x - line_v2->x;
  fVar2 = line_v1->y - line_v2->y;
  fVar1 = (line_v1->x * line_v2->y + (fVar2 * point->x - fVar4 * point->y)) -
          line_v2->x * line_v1->y;
  fVar3 = -fVar1;
  if (-fVar1 <= fVar1) {
    fVar3 = fVar1;
  }
  fVar3 = fVar3 / SQRT(fVar4 * fVar4 + fVar2 * fVar2);
  fVar1 = -fVar3;
  if (-fVar3 <= fVar3) {
    fVar1 = fVar3;
  }
  return fVar1 < 0.001;
}

Assistant:

bool TessellationShaderVertexSpacing::isPointOnLine(const _tess_coordinate_cartesian& line_v1,
													const _tess_coordinate_cartesian& line_v2,
													const _tess_coordinate_cartesian& point)

{
	bool result = false;

	/* Calculate distance from a point to a line passing through two points */
	float Dx		  = line_v1.x - line_v2.x;
	float Dy		  = line_v1.y - line_v2.y;
	float denominator = deFloatSqrt(Dx * Dx + Dy * Dy);
	float d = de::abs(Dy * point.x - Dx * point.y + line_v1.x * line_v2.y - line_v2.x * line_v1.y) / denominator;

	if (de::abs(d) < epsilon)
	{
		result = true;
	}

	return result;
}